

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpTypeStruct
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  size_t sVar1;
  IRContext *pIVar2;
  vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *pvVar3;
  EliminateDeadMembersPass *pEVar4;
  uint32_t uVar5;
  mapped_type *pmVar6;
  Operand *__args;
  _Base_ptr p_Var7;
  pointer pOVar8;
  uint uVar9;
  ulong uVar10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  OperandList new_operands;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_58;
  EliminateDeadMembersPass *local_40;
  vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *local_38;
  
  if (inst->opcode_ != OpTypeStruct) {
    __assert_fail("inst->opcode() == spv::Op::OpTypeStruct",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x166,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpTypeStruct(Instruction *)")
    ;
  }
  uVar5 = 0;
  if (inst->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_58.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar5);
  pmVar6 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->used_members_,(key_type *)&local_58);
  sVar1 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  pOVar8 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8;
  uVar9 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar9 = (uint)inst->has_result_id_;
  }
  uVar12 = (ulong)((int)(uVar10 >> 4) * -0x55555555 - uVar9);
  if (sVar1 != uVar12) {
    local_38 = (vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &inst->operands_;
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var7 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
    pEVar4 = this;
    if ((_Rb_tree_header *)p_Var7 != p_Var11) {
      do {
        local_40 = pEVar4;
        __args = Instruction::GetInOperand(inst,p_Var7[1]._M_color);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_58,__args);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        pEVar4 = local_40;
      } while ((_Rb_tree_header *)p_Var7 != p_Var11);
      pOVar8 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (inst->has_result_id_ & 1) + 1;
      if ((inst->has_type_id_ & 1U) == 0) {
        uVar9 = (uint)inst->has_result_id_;
      }
      uVar10 = (long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8;
      this = local_40;
    }
    pvVar3 = local_38;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_38,
               (Operand *)
               ((long)((pOVar8->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar9 * 0x30)),
               (Operand *)((long)((pOVar8->words).buffer + 0xfffffffffffffffa) + uVar10));
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
              (pvVar3,(inst->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
               local_58.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::UpdateDefUse
                ((pIVar2->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58)
    ;
  }
  return sVar1 != uVar12;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpTypeStruct(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpTypeStruct);

  const auto& live_members = used_members_[inst->result_id()];
  if (live_members.size() == inst->NumInOperands()) {
    return false;
  }

  Instruction::OperandList new_operands;
  for (uint32_t idx : live_members) {
    new_operands.emplace_back(inst->GetInOperand(idx));
  }

  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}